

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNABase::OPNABase(OPNABase *this)

{
  Channel4 *local_28;
  int local_20;
  int i;
  OPNABase *this_local;
  
  OPNBase::OPNBase(&this->super_OPNBase);
  (this->super_OPNBase).super_Timer._vptr_Timer = (_func_int **)&PTR_SetStatus_002fbb28;
  local_28 = (Channel4 *)&this->field_0x280;
  do {
    Channel4::Channel4(local_28);
    local_28 = local_28 + 1;
  } while ((OPNABase *)local_28 != this + 1);
  this->adpcmbuf = (uint8 *)0x0;
  this->memaddr = 0;
  this->startaddr = 0;
  this->deltan = 0x100;
  this->adpcmvol = 0;
  this->control2 = '\0';
  MakeTable2(this);
  BuildLFOTable();
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    Channel4::SetChip((Channel4 *)(this->adpcmreg + (long)local_20 * 0x2e0 + 0xf),
                      &(this->super_OPNBase).chip);
    Channel4::SetType((Channel4 *)(this->adpcmreg + (long)local_20 * 0x2e0 + 0xf),typeN);
  }
  return;
}

Assistant:

OPNABase::OPNABase()
{
	adpcmbuf = 0;
	memaddr = 0;
	startaddr = 0;
	deltan = 256;

	adpcmvol = 0;
	control2 = 0;

	MakeTable2();
	BuildLFOTable();
	for (int i=0; i<6; i++)
	{
		ch[i].SetChip(&chip);
		ch[i].SetType(typeN);
	}
}